

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QSet<QtGraphicsAnchorLayout::AnchorData_*> * __thiscall
QSet<QtGraphicsAnchorLayout::AnchorData_*>::intersect
          (QSet<QtGraphicsAnchorLayout::AnchorData_*> *this,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *other)

{
  Data *pDVar1;
  Data *pDVar2;
  long in_FS_OFFSET;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->q_hash).d;
  pDVar2 = (other->q_hash).d;
  if (pDVar1 != pDVar2) {
    if ((((pDVar1 == (Data *)0x0) || (pDVar2 == (Data *)0x0)) || (pDVar1->size == 0)) ||
       (pDVar2->size == 0)) {
      QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::clear(&this->q_hash);
    }
    else if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      QSet<QtGraphicsAnchorLayout::AnchorData*>::
      removeIf<QSet<QtGraphicsAnchorLayout::AnchorData*>::intersect(QSet<QtGraphicsAnchorLayout::AnchorData*>const&)::_lambda(QtGraphicsAnchorLayout::AnchorData*const&)_1_>
                ((QSet<QtGraphicsAnchorLayout::AnchorData*> *)this,(anon_class_8_1_a86c6e30)other);
    }
    else {
      intersected_helper((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_20,this,other);
      QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::operator=
                (&this->q_hash,&local_20);
      QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Q_INLINE_TEMPLATE QSet<T> &QSet<T>::intersect(const QSet<T> &other)
{
    if (q_hash.isSharedWith(other.q_hash)) {
        // nothing to do
    } else if (isEmpty() || other.isEmpty()) {
        // any set intersected with the empty set is the empty set
        clear();
    } else if (q_hash.isDetached()) {
        // do it in-place:
        removeIf([&other] (const T &e) { return !other.contains(e); });
    } else {
        // don't detach *this just to remove some items; create a new set
        *this = intersected_helper(*this, other);
    }
    return *this;
}